

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rest.cpp
# Opt level: O1

bool rest_getutxos(any *context,HTTPRequest *req,string *strURIPart)

{
  byte *pbVar1;
  RecursiveMutex *pRVar2;
  string key;
  string key_00;
  string key_01;
  string key_02;
  string key_03;
  string key_04;
  string key_05;
  UniValue val;
  UniValue val_00;
  UniValue val_01;
  UniValue val_02;
  UniValue val_03;
  UniValue val_04;
  UniValue val_05;
  UniValue val_06;
  undefined8 *puVar3;
  long lVar4;
  void *pvVar5;
  span<const_std::byte,_18446744073709551615UL> reply;
  span<const_std::byte,_18446744073709551615UL> reply_00;
  util uVar6;
  pointer pbVar7;
  bool bVar8;
  RESTResponseFormat RVar9;
  int iVar10;
  ChainstateManager *this;
  CTxMemPool *mempoolIn;
  Chainstate *pCVar11;
  CCoinsViewCache *pCVar12;
  DataStream *pDVar13;
  undefined1 in_RCX [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar14;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar15;
  ulong uVar16;
  pointer pcVar17;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar18;
  unique_lock<std::recursive_mutex> *this_00;
  CCoinsView *in_R8;
  char *pcVar19;
  _Alloc_hider _Var20;
  ulong uVar21;
  long in_FS_OFFSET;
  char cVar22;
  string_view str;
  span<const_std::byte,_18446744073709551615UL> reply_01;
  string_view hex_str;
  Span<const_unsigned_char> s;
  __integer_from_chars_result_type<unsigned_int> _Var23;
  string_view separators;
  string_view separators_00;
  int active_height;
  vector<CCoin,_std::allocator<CCoin>_> outs;
  vector<unsigned_char,_std::allocator<unsigned_char>_> bitmap;
  vector<COutPoint,_std::allocator<COutPoint>_> vOutPoints;
  vector<bool,_std::allocator<bool>_> hits;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock2;
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  txid_out;
  optional<transaction_identifier<false>_> txid;
  string strUriParams;
  uint256 active_hash;
  string bitmapStringRepresentation;
  string strRequestMutable;
  string param;
  undefined4 uVar24;
  undefined4 in_stack_fffffffffffff744;
  undefined4 uVar25;
  undefined4 in_stack_fffffffffffff748;
  undefined4 in_stack_fffffffffffff74c;
  pointer in_stack_fffffffffffff750;
  any *in_stack_fffffffffffff758;
  undefined4 in_stack_fffffffffffff760;
  int in_stack_fffffffffffff764;
  _Alloc_hider _Var26;
  pointer pCVar27;
  undefined8 uVar28;
  undefined8 in_stack_fffffffffffff780;
  pointer in_stack_fffffffffffff788;
  pointer pUVar29;
  pointer puVar30;
  pointer in_stack_fffffffffffff798;
  pointer puVar31;
  undefined8 in_stack_fffffffffffff7a0;
  _Alloc_hider _Var32;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_838;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_820;
  long local_800;
  string local_7f8;
  string local_7d8;
  UniValue local_7b8;
  long *local_760 [2];
  long local_750 [2];
  VType local_740;
  pointer local_738;
  pointer local_730;
  undefined1 local_728 [32];
  pointer local_708;
  vector<UniValue,_std::allocator<UniValue>_> local_700;
  VType local_6e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_6e0;
  size_type local_6d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_6d0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_6c0;
  vector<UniValue,_std::allocator<UniValue>_> local_6a8;
  long *local_690 [2];
  long local_680 [2];
  undefined1 *local_670;
  undefined8 local_668;
  undefined1 local_660;
  uint7 uStack_65f;
  undefined8 uStack_658;
  undefined1 local_650 [16];
  undefined1 local_640 [24];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_628;
  vector<UniValue,_std::allocator<UniValue>_> vStack_610;
  UniValue local_5f8;
  long *local_5a0 [2];
  long local_590 [2];
  UniValue local_580;
  long *local_528 [2];
  long local_518 [2];
  undefined1 *local_508;
  undefined8 local_500;
  undefined1 local_4f8;
  uint7 uStack_4f7;
  size_type sStack_4f0;
  undefined1 local_4e8 [16];
  undefined1 local_4d8 [8];
  undefined1 auStack_4d0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4c0;
  pointer local_4b0;
  vector<UniValue,_std::allocator<UniValue>_> vStack_4a8;
  undefined1 *local_488;
  undefined8 local_480;
  undefined1 local_478 [9];
  undefined4 local_46f;
  undefined2 local_46b;
  char local_469;
  undefined1 local_468 [16];
  undefined1 local_458 [8];
  undefined1 auStack_450 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_440;
  pointer local_430;
  pointer pUStack_428;
  pointer local_420;
  pointer pUStack_418;
  UniValue local_410;
  long *local_3b8 [2];
  long local_3a8 [2];
  UniValue local_398;
  long *local_340 [2];
  long local_330 [2];
  UniValue local_320;
  long *local_2c8 [2];
  long local_2b8 [2];
  undefined1 *local_2a8;
  undefined8 local_2a0;
  undefined1 local_298 [9];
  undefined4 local_28f;
  undefined2 local_28b;
  char local_289;
  undefined1 local_288 [16];
  undefined1 local_278 [56];
  pointer local_240;
  pointer pUStack_238;
  _Hashtable<COutPoint,_COutPoint,_std::allocator<COutPoint>,_std::__detail::_Identity,_std::equal_to<COutPoint>,_SaltedOutpointHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_230;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b8;
  string local_198;
  string local_178;
  string local_158 [2];
  string local_118;
  string local_f8;
  string local_d8;
  string local_b8;
  string local_98;
  string local_78;
  string local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  bVar8 = CheckWarmup(req);
  if (!bVar8) {
    bVar8 = false;
    goto LAB_0028edf3;
  }
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  local_58._M_string_length = 0;
  local_58.field_2._M_local_buf[0] = '\0';
  RVar9 = ParseDataFormat(&local_58,strURIPart);
  local_838.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_838.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_838.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (1 < local_58._M_string_length) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_288,
               &local_58,1,0xffffffffffffffff);
    local_468._0_4_ = (undefined4)local_288._0_8_;
    local_468._4_4_ = SUB84(local_288._0_8_,4);
    local_468._8_4_ = (undefined4)local_288._8_8_;
    local_468._12_4_ = SUB84(local_288._8_8_,4);
    local_650[0] = 0x2f;
    separators._M_str = (char *)in_R8;
    separators._M_len = (size_t)local_650;
    util::Split<std::__cxx11::string>
              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_4e8,(util *)local_468,(Span<const_char> *)0x1,separators);
    in_RCX = local_4d8;
    local_458 = (undefined1  [8])
                local_838.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage;
    pbVar18 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              CONCAT44(local_4e8._4_4_,local_4e8._0_4_);
    pbVar14 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              CONCAT44(local_4e8._12_4_,local_4e8._8_4_);
    local_838.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_4d8;
    local_468._0_4_ =
         SUB84(local_838.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start,0);
    local_468._4_4_ =
         (undefined4)
         ((ulong)local_838.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 0x20);
    local_468._8_4_ =
         SUB84(local_838.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish,0);
    local_468._12_4_ =
         (undefined4)
         ((ulong)local_838.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish >> 0x20);
    local_4e8._0_4_ = VNULL;
    local_4e8._4_4_ = 0;
    local_4e8._8_4_ = 0;
    local_4e8._12_4_ = 0;
    local_4d8 = (undefined1  [8])0x0;
    local_838.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = pbVar18;
    local_838.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = pbVar14;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_468);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_4e8);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_288._0_8_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_288 + 0x10)) {
      operator_delete((void *)local_288._0_8_,(ulong)(local_278._0_8_ + 1));
    }
  }
  HTTPRequest::ReadBody_abi_cxx11_(&local_78,req);
  pbVar7 = local_838.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((local_78._M_string_length == 0) &&
     (local_838.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      local_838.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start)) {
    local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"Error: empty request","");
    RESTERR(req,HTTP_BAD_REQUEST,&local_98);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
    bVar8 = false;
  }
  else {
    _Var32._M_p = (pointer)0x0;
    if (local_838.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish ==
        local_838.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      cVar22 = '\0';
      pbVar18 = local_838.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
LAB_0028e71a:
      if (RVar9 != BINARY) {
        if (RVar9 == JSON) {
          if (pbVar18 == pbVar7) {
            local_158[0]._M_dataplus._M_p = (pointer)&local_158[0].field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_158,"Error: empty request","");
            RESTERR(req,HTTP_BAD_REQUEST,local_158);
            local_198._M_dataplus._M_p = local_158[0]._M_dataplus._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_158[0]._M_dataplus._M_p != &local_158[0].field_2) goto LAB_0028ed7c;
            goto LAB_0028ed84;
          }
          goto LAB_0028ea6a;
        }
        if (RVar9 == HEX) {
          hex_str._M_str = local_78._M_dataplus._M_p;
          hex_str._M_len = local_78._M_string_length;
          ParseHex<unsigned_char>
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_288,hex_str);
          in_RCX = (undefined1  [8])local_288._0_8_;
          in_R8 = (CCoinsView *)local_288._8_8_;
          std::__cxx11::string::
          _M_replace_dispatch<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                    ((string *)&local_78,local_78._M_dataplus._M_p,
                     local_78._M_dataplus._M_p + local_78._M_string_length);
          if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_288._0_8_
              != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            operator_delete((void *)local_288._0_8_,local_278._0_8_ - local_288._0_8_);
          }
          goto LAB_0028e792;
        }
        AvailableDataFormatsString_abi_cxx11_();
        pbVar18 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  replace((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_468,0,0,"output format not found (available: ",0x24);
        local_288._0_8_ = (pbVar18->_M_dataplus)._M_p;
        paVar15 = &pbVar18->field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_288._0_8_ == paVar15) {
          local_278._0_8_ = paVar15->_M_allocated_capacity;
          uVar28 = *(undefined8 *)((long)&pbVar18->field_2 + 8);
          local_278._8_4_ = (undefined4)uVar28;
          local_278._12_4_ = (undefined4)((ulong)uVar28 >> 0x20);
          local_288._0_8_ =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               (local_288 + 0x10);
        }
        else {
          local_278._0_8_ = paVar15->_M_allocated_capacity;
        }
        local_288._8_8_ = pbVar18->_M_string_length;
        (pbVar18->_M_dataplus)._M_p = (pointer)paVar15;
        pbVar18->_M_string_length = 0;
        (pbVar18->field_2)._M_local_buf[0] = '\0';
        pbVar18 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_288,")");
        local_178._M_dataplus._M_p = (pbVar18->_M_dataplus)._M_p;
        paVar15 = &pbVar18->field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_178._M_dataplus._M_p == paVar15) {
          local_178.field_2._M_allocated_capacity = paVar15->_M_allocated_capacity;
          local_178.field_2._8_8_ = *(undefined8 *)((long)&pbVar18->field_2 + 8);
          local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
        }
        else {
          local_178.field_2._M_allocated_capacity = paVar15->_M_allocated_capacity;
        }
        local_178._M_string_length = pbVar18->_M_string_length;
        (pbVar18->_M_dataplus)._M_p = (pointer)paVar15;
        pbVar18->_M_string_length = 0;
        (pbVar18->field_2)._M_local_buf[0] = '\0';
        RESTERR(req,HTTP_NOT_FOUND,&local_178);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_178._M_dataplus._M_p != &local_178.field_2) {
          operator_delete(local_178._M_dataplus._M_p,local_178.field_2._M_allocated_capacity + 1);
        }
        if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_288._0_8_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_288 + 0x10))
        {
          operator_delete((void *)local_288._0_8_,(ulong)(local_278._0_8_ + 1));
        }
        local_198._M_dataplus._M_p = (pointer)CONCAT44(local_468._4_4_,local_468._0_4_);
        local_158[0].field_2._0_8_ = local_458;
        if (local_198._M_dataplus._M_p == local_458) goto LAB_0028ed84;
LAB_0028ed7c:
        pcVar17 = (pointer)((long)&(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)local_158[0].field_2._0_8_)->_M_dataplus)._M_p + 1);
LAB_0028ed7f:
        operator_delete(local_198._M_dataplus._M_p,(ulong)pcVar17);
        goto LAB_0028ed84;
      }
LAB_0028e792:
      if (local_78._M_string_length != 0) {
        if (pbVar18 != pbVar7) {
          local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_118,
                     "Combination of URI scheme inputs and raw post data is not allowed","");
          RESTERR(req,HTTP_BAD_REQUEST,&local_118);
          local_158[0].field_2._M_allocated_capacity = local_118.field_2._M_allocated_capacity;
          local_198._M_dataplus._M_p = local_118._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_118._M_dataplus._M_p != &local_118.field_2) goto LAB_0028ed7c;
          goto LAB_0028ed84;
        }
        local_278._0_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        local_278._8_4_ = 0;
        local_278._12_4_ = 0;
        local_288._0_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        local_288._8_8_ = (CCoinsView *)0x0;
        Serialize<DataStream,char>((DataStream *)local_288,&local_78);
        DataStream::read((DataStream *)local_288,(int)local_468,(void *)0x1,(size_t)in_RCX);
        uVar6 = local_468[0];
        VectorFormatter<DefaultFormatter>::
        Unser<DataStream,std::vector<COutPoint,std::allocator<COutPoint>>>
                  ((VectorFormatter<DefaultFormatter> *)local_468,(DataStream *)local_288,
                   (vector<COutPoint,_std::allocator<COutPoint>_> *)&stack0xfffffffffffff7a8);
        cVar22 = uVar6 != (util)0x0;
        std::_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>::~_Vector_base
                  ((_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_> *)local_288);
      }
LAB_0028ea6a:
      pbVar18 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                ((-(long)_Var32._M_p >> 2) * -0x71c71c71c71c71c7);
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0xf < pbVar18) {
        local_288._0_8_ = pbVar18;
        tinyformat::format<unsigned_long,unsigned_long>
                  (&local_198,(tinyformat *)"Error: max outpoints exceeded (max: %d, tried: %d)",
                   "\x0f",(unsigned_long *)local_288,(unsigned_long *)in_R8);
        RESTERR(req,HTTP_BAD_REQUEST,&local_198);
        local_158[0].field_2._M_allocated_capacity = local_198.field_2._M_allocated_capacity;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_198._M_dataplus._M_p == &local_198.field_2) goto LAB_0028ed84;
        goto LAB_0028ed7c;
      }
      pUVar29 = (pointer)0x0;
      puVar30 = (pointer)0x0;
      puVar31 = (pointer)0x0;
      uVar28 = 0;
      _Var20._M_p = (pointer)0x0;
      pCVar27 = (pointer)0x0;
      local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
      local_1b8._M_string_length = 0;
      local_1b8.field_2._M_local_buf[0] = '\0';
      local_820._M_dataplus._M_p = (pointer)0x0;
      local_820._M_string_length._0_4_ = 0;
      local_820.field_2._M_allocated_capacity = 0;
      local_820.field_2._8_4_ = 0;
      local_800 = 0;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&stack0xfffffffffffff788,
                 (ulong)((long)&(pbVar18->_M_dataplus)._M_p + 7) >> 3);
      this = GetChainman(context,req);
      if (this == (ChainstateManager *)0x0) {
LAB_0028fb7f:
        bVar8 = false;
      }
      else {
        local_1c8 = 0;
        uStack_1c0 = 0;
        local_1d8 = 0;
        uStack_1d0 = 0;
        local_468._0_8_ = &stack0xfffffffffffff7a8;
        local_468._8_8_ = &stack0xfffffffffffff768;
        local_458 = (undefined1  [8])&local_820;
        auStack_450._0_8_ = &stack0xfffffffffffff764;
        auStack_450[8] = SUB81(&local_1d8,0);
        auStack_450._9_4_ = (undefined4)((ulong)&local_1d8 >> 8);
        auStack_450._13_2_ = (undefined2)((ulong)&local_1d8 >> 0x28);
        auStack_450[0xf] = (undefined1)((ulong)&local_1d8 >> 0x38);
        local_440._M_allocated_capacity = (size_type)this;
        if (cVar22 == '\0') {
          local_288._0_8_ = &cs_main;
          local_288._8_8_ = local_288._8_8_ & 0xffffffffffffff00;
          std::unique_lock<std::recursive_mutex>::lock
                    ((unique_lock<std::recursive_mutex> *)local_288);
          pCVar11 = ChainstateManager::ActiveChainstate(this);
          pCVar12 = Chainstate::CoinsTip(pCVar11);
          rest_getutxos::anon_class_48_6_125dcb17::operator()
                    ((anon_class_48_6_125dcb17 *)local_468,(CCoinsView *)pCVar12,(CTxMemPool *)0x0);
          this_00 = (unique_lock<std::recursive_mutex> *)local_288;
        }
        else {
          mempoolIn = GetMemPool(context,req);
          if (mempoolIn == (CTxMemPool *)0x0) goto LAB_0028fb7f;
          local_4e8._0_4_ = 0xb1d050;
          local_4e8._4_4_ = 0;
          local_4e8._8_4_ = local_4e8._8_4_ & 0xffffff00;
          std::unique_lock<std::recursive_mutex>::lock
                    ((unique_lock<std::recursive_mutex> *)local_4e8);
          local_650._0_8_ = &mempoolIn->cs;
          local_650._8_8_ = local_650._8_8_ & 0xffffffffffffff00;
          std::unique_lock<std::recursive_mutex>::lock
                    ((unique_lock<std::recursive_mutex> *)local_650);
          pCVar11 = ChainstateManager::ActiveChainstate(this);
          pCVar12 = Chainstate::CoinsTip(pCVar11);
          CCoinsViewMemPool::CCoinsViewMemPool
                    ((CCoinsViewMemPool *)local_288,(CCoinsView *)pCVar12,mempoolIn);
          rest_getutxos::anon_class_48_6_125dcb17::operator()
                    ((anon_class_48_6_125dcb17 *)local_468,(CCoinsView *)local_288,mempoolIn);
          local_288._0_8_ = &PTR_GetCoin_00b14438;
          std::
          _Hashtable<COutPoint,_COutPoint,_std::allocator<COutPoint>,_std::__detail::_Identity,_std::equal_to<COutPoint>,_SaltedOutpointHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::~_Hashtable(&local_230);
          std::
          _Hashtable<COutPoint,_std::pair<const_COutPoint,_Coin>,_std::allocator<std::pair<const_COutPoint,_Coin>_>,_std::__detail::_Select1st,_std::equal_to<COutPoint>,_SaltedOutpointHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::~_Hashtable((_Hashtable<COutPoint,_std::pair<const_COutPoint,_Coin>,_std::allocator<std::pair<const_COutPoint,_Coin>_>,_std::__detail::_Select1st,_std::equal_to<COutPoint>,_SaltedOutpointHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                         *)(local_288 + 0x10));
          std::unique_lock<std::recursive_mutex>::~unique_lock
                    ((unique_lock<std::recursive_mutex> *)local_650);
          this_00 = (unique_lock<std::recursive_mutex> *)local_4e8;
        }
        std::unique_lock<std::recursive_mutex>::~unique_lock(this_00);
        pbVar7 = (pointer)local_468._0_8_;
        if ((local_820.field_2._M_allocated_capacity - (long)local_820._M_dataplus._M_p) * 8 +
            (ulong)(uint)local_820.field_2._8_4_ != 0) {
          uVar16 = 0;
          do {
            uVar21 = uVar16 + 0x3f;
            if (-1 < (long)uVar16) {
              uVar21 = uVar16;
            }
            uVar21 = 1L << ((byte)uVar16 & 0x3f) &
                     *(ulong *)(local_820._M_dataplus._M_p +
                               (ulong)((uVar16 & 0x800000000000003f) < 0x8000000000000001) * 8 +
                               ((long)uVar21 >> 6) * 8 + -8);
            pcVar19 = "0";
            if (uVar21 != 0) {
              pcVar19 = "1";
            }
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                      (&local_1b8,pcVar19);
            pbVar1 = (byte *)((long)&pUVar29->typ + (uVar16 >> 3));
            *pbVar1 = *pbVar1 | (uVar21 != 0) << ((byte)uVar16 & 7);
            uVar16 = uVar16 + 1;
            pbVar7 = (pointer)local_468._0_8_;
          } while (uVar16 < (ulong)(uint)local_820.field_2._8_4_ +
                            (local_820.field_2._M_allocated_capacity -
                            (long)local_820._M_dataplus._M_p) * 8);
        }
        local_468._4_4_ = (undefined4)((ulong)pbVar7 >> 0x20);
        if (RVar9 == BINARY) {
          local_278._0_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
          ;
          local_278._8_4_ = 0;
          local_278._12_4_ = 0;
          local_288._0_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
          ;
          local_288._8_8_ = (CCoinsView *)0x0;
          std::vector<std::byte,zero_after_free_allocator<std::byte>>::
          _M_range_insert<std::byte_const*>
                    ((vector<std::byte,zero_after_free_allocator<std::byte>> *)local_288,0,local_468
                    );
          std::vector<std::byte,zero_after_free_allocator<std::byte>>::
          _M_range_insert<std::byte_const*>
                    ((vector<std::byte,zero_after_free_allocator<std::byte>> *)local_288,
                     local_288._8_8_,&local_1d8,&local_1b8);
          pDVar13 = DataStream::operator<<
                              ((DataStream *)local_288,
                               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                               &stack0xfffffffffffff788);
          VectorFormatter<DefaultFormatter>::
          Ser<DataStream,std::vector<CCoin,std::allocator<CCoin>>>
                    ((VectorFormatter<DefaultFormatter> *)local_468,pDVar13,
                     (vector<CCoin,_std::allocator<CCoin>_> *)&stack0xfffffffffffff768);
          local_468._0_8_ = (pointer)local_458;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_468,"Content-Type","");
          local_4e8._0_8_ = (pointer)local_4d8;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_4e8,"application/octet-stream","");
          HTTPRequest::WriteHeader(req,(string *)local_468,(string *)local_4e8);
          if ((pointer)local_4e8._0_8_ != (pointer)local_4d8) {
            operator_delete((void *)local_4e8._0_8_,(ulong)((long)local_4d8 + 1));
          }
          if ((pointer)local_468._0_8_ != (pointer)local_458) {
            operator_delete((void *)local_468._0_8_,(ulong)((long)local_458 + 1));
          }
          reply_01._M_ptr = (pointer)(local_288._0_8_ + CONCAT44(local_278._12_4_,local_278._8_4_));
          reply_01._M_extent._M_extent_value = local_288._8_8_ - (long)reply_01._M_ptr;
          HTTPRequest::WriteReply(req,200,reply_01);
LAB_0028fc9c:
          std::_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>::~_Vector_base
                    ((_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_> *)local_288);
        }
        else {
          if (RVar9 == HEX) {
            local_278._0_8_ =
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
            local_278._8_4_ = 0;
            local_278._12_4_ = 0;
            local_288._0_8_ =
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
            local_288._8_8_ = (CCoinsView *)0x0;
            std::vector<std::byte,zero_after_free_allocator<std::byte>>::
            _M_range_insert<std::byte_const*>
                      ((vector<std::byte,zero_after_free_allocator<std::byte>> *)local_288,0,
                       local_468);
            std::vector<std::byte,zero_after_free_allocator<std::byte>>::
            _M_range_insert<std::byte_const*>
                      ((vector<std::byte,zero_after_free_allocator<std::byte>> *)local_288,
                       local_288._8_8_,&local_1d8,&local_1b8);
            pDVar13 = DataStream::operator<<
                                ((DataStream *)local_288,
                                 (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                 &stack0xfffffffffffff788);
            VectorFormatter<DefaultFormatter>::
            Ser<DataStream,std::vector<CCoin,std::allocator<CCoin>>>
                      ((VectorFormatter<DefaultFormatter> *)local_468,pDVar13,
                       (vector<CCoin,_std::allocator<CCoin>_> *)&stack0xfffffffffffff768);
            s.m_data = (uchar *)(local_288._0_8_ + CONCAT44(local_278._12_4_,local_278._8_4_));
            s.m_size = local_288._8_8_ - (long)s.m_data;
            HexStr_abi_cxx11_((string *)local_4e8,s);
            pbVar18 = std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_4e8,"\n");
            local_468._0_8_ = (pbVar18->_M_dataplus)._M_p;
            paVar15 = &pbVar18->field_2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_468._0_8_ == paVar15) {
              local_458 = (undefined1  [8])paVar15->_M_allocated_capacity;
              auStack_450._0_8_ = *(long *)((long)&pbVar18->field_2 + 8);
              local_468._0_8_ = (pointer)local_458;
            }
            else {
              local_458 = (undefined1  [8])paVar15->_M_allocated_capacity;
            }
            local_468._8_4_ = (undefined4)pbVar18->_M_string_length;
            local_468._12_4_ = (undefined4)(pbVar18->_M_string_length >> 0x20);
            (pbVar18->_M_dataplus)._M_p = (pointer)paVar15;
            pbVar18->_M_string_length = 0;
            (pbVar18->field_2)._M_local_buf[0] = '\0';
            if ((pointer)CONCAT44(local_4e8._4_4_,local_4e8._0_4_) != (pointer)local_4d8) {
              operator_delete((pointer)CONCAT44(local_4e8._4_4_,local_4e8._0_4_),
                              (ulong)((long)local_4d8 + 1));
            }
            local_4e8._0_8_ = (pointer)local_4d8;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_4e8,"Content-Type","");
            local_650._0_8_ = (RecursiveMutex *)(local_650 + 0x10);
            std::__cxx11::string::_M_construct<char_const*>((string *)local_650,"text/plain","");
            HTTPRequest::WriteHeader(req,(string *)local_4e8,(string *)local_650);
            if ((RecursiveMutex *)local_650._0_8_ != (RecursiveMutex *)(local_650 + 0x10)) {
              operator_delete((void *)local_650._0_8_,local_640._0_8_ + 1);
            }
            if ((pointer)local_4e8._0_8_ != (pointer)local_4d8) {
              operator_delete((void *)local_4e8._0_8_,(ulong)((long)local_4d8 + 1));
            }
            reply_00._M_extent._M_extent_value._0_4_ = local_468._8_4_;
            reply_00._M_ptr = (pointer)local_468._0_8_;
            reply_00._M_extent._M_extent_value._4_4_ = local_468._12_4_;
            HTTPRequest::WriteReply(req,200,reply_00);
            if ((pointer)local_468._0_8_ != (pointer)local_458) {
              operator_delete((void *)local_468._0_8_,(ulong)((long)local_458 + 1));
            }
            goto LAB_0028fc9c;
          }
          local_468._0_8_ = pbVar7;
          if (RVar9 != JSON) {
            AvailableDataFormatsString_abi_cxx11_();
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_288,"output format not found (available: ",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_468);
            pbVar18 = std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_288,")");
            local_7f8._M_dataplus._M_p = (pbVar18->_M_dataplus)._M_p;
            paVar15 = &pbVar18->field_2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_7f8._M_dataplus._M_p == paVar15) {
              local_7f8.field_2._M_allocated_capacity = paVar15->_M_allocated_capacity;
              local_7f8.field_2._8_8_ = *(undefined8 *)((long)&pbVar18->field_2 + 8);
              local_7f8._M_dataplus._M_p = (pointer)&local_7f8.field_2;
            }
            else {
              local_7f8.field_2._M_allocated_capacity = paVar15->_M_allocated_capacity;
            }
            local_7f8._M_string_length = pbVar18->_M_string_length;
            (pbVar18->_M_dataplus)._M_p = (pointer)paVar15;
            pbVar18->_M_string_length = 0;
            (pbVar18->field_2)._M_local_buf[0] = '\0';
            RESTERR(req,HTTP_NOT_FOUND,&local_7f8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_7f8._M_dataplus._M_p != &local_7f8.field_2) {
              operator_delete(local_7f8._M_dataplus._M_p,local_7f8.field_2._M_allocated_capacity + 1
                             );
            }
            if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_288._0_8_
                != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_288 + 0x10)) {
              operator_delete((void *)local_288._0_8_,(ulong)(local_278._0_8_ + 1));
            }
            if ((pointer)local_468._0_8_ != (pointer)local_458) {
              operator_delete((void *)local_468._0_8_,(ulong)((long)local_458 + 1));
            }
            goto LAB_0028fb7f;
          }
          local_2a8 = local_298;
          local_2a0 = 0;
          local_288._8_8_ = local_288 + 0x18;
          local_288._0_4_ = 1;
          local_278._9_3_ = (undefined3)local_298._1_8_;
          local_278._8_4_ = (uint)(uint3)local_278._9_3_ << 8;
          local_278._12_4_ = SUB84(local_298._1_8_,3);
          local_278[0x10] = SUB81(local_298._1_8_,7);
          local_278._17_4_ = local_28f;
          local_278._21_2_ = local_28b;
          local_278[0x17] = local_289;
          local_278._0_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
          ;
          local_298[0] = 0;
          local_278._24_8_ = (pointer)0x0;
          local_278._32_8_ = (_Hash_node_base *)0x0;
          local_278._40_8_ = (pointer)0x0;
          local_278._48_8_ = (pointer)0x0;
          local_240 = (pointer)0x0;
          pUStack_238 = (pointer)0x0;
          local_2c8[0] = local_2b8;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_2c8,"chainHeight","");
          UniValue::UniValue<int_&,_int,_true>(&local_320,(int *)&stack0xfffffffffffff764);
          key._M_string_length._0_4_ = RVar9;
          key._M_dataplus._M_p = (pointer)req;
          key._M_string_length._4_4_ = in_stack_fffffffffffff744;
          key.field_2._M_allocated_capacity._0_4_ = in_stack_fffffffffffff748;
          key.field_2._M_allocated_capacity._4_4_ = in_stack_fffffffffffff74c;
          key.field_2._8_8_ = in_stack_fffffffffffff750;
          val_00.val._M_dataplus._M_p._0_4_ = in_stack_fffffffffffff760;
          val_00._0_8_ = in_stack_fffffffffffff758;
          val_00.val._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff764;
          val_00.val._M_string_length = (size_type)_Var20._M_p;
          val_00.val.field_2._M_allocated_capacity = (size_type)pCVar27;
          val_00.val.field_2._8_8_ = uVar28;
          val_00.keys.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffff780;
          val_00.keys.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)pUVar29;
          val_00.keys.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)puVar30;
          val_00.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)puVar31;
          val_00.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffff7a0;
          val_00.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)_Var32._M_p;
          UniValue::pushKV((UniValue *)local_288,key,val_00);
          UniValue::~UniValue(&local_320);
          if (local_2c8[0] != local_2b8) {
            operator_delete(local_2c8[0],local_2b8[0] + 1);
          }
          local_340[0] = local_330;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_340,"chaintipHash","");
          base_blob<256u>::GetHex_abi_cxx11_((string *)local_468,&local_1d8);
          UniValue::
          UniValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                    (&local_398,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_468)
          ;
          key_00._M_string_length._0_4_ = RVar9;
          key_00._M_dataplus._M_p = (pointer)req;
          key_00._M_string_length._4_4_ = in_stack_fffffffffffff744;
          key_00.field_2._M_allocated_capacity._0_4_ = in_stack_fffffffffffff748;
          key_00.field_2._M_allocated_capacity._4_4_ = in_stack_fffffffffffff74c;
          key_00.field_2._8_8_ = in_stack_fffffffffffff750;
          val_01.val._M_dataplus._M_p._0_4_ = in_stack_fffffffffffff760;
          val_01._0_8_ = in_stack_fffffffffffff758;
          val_01.val._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff764;
          val_01.val._M_string_length = (size_type)_Var20._M_p;
          val_01.val.field_2._M_allocated_capacity = (size_type)pCVar27;
          val_01.val.field_2._8_8_ = uVar28;
          val_01.keys.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffff780;
          val_01.keys.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)pUVar29;
          val_01.keys.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)puVar30;
          val_01.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)puVar31;
          val_01.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffff7a0;
          val_01.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)_Var32._M_p;
          UniValue::pushKV((UniValue *)local_288,key_00,val_01);
          UniValue::~UniValue(&local_398);
          if ((pointer)local_468._0_8_ != (pointer)local_458) {
            operator_delete((void *)local_468._0_8_,(ulong)((long)local_458 + 1));
          }
          if (local_340[0] != local_330) {
            operator_delete(local_340[0],local_330[0] + 1);
          }
          local_3b8[0] = local_3a8;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_3b8,"bitmap","");
          UniValue::
          UniValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                    (&local_410,&local_1b8);
          key_01._M_string_length._0_4_ = RVar9;
          key_01._M_dataplus._M_p = (pointer)req;
          key_01._M_string_length._4_4_ = in_stack_fffffffffffff744;
          key_01.field_2._M_allocated_capacity._0_4_ = in_stack_fffffffffffff748;
          key_01.field_2._M_allocated_capacity._4_4_ = in_stack_fffffffffffff74c;
          key_01.field_2._8_8_ = in_stack_fffffffffffff750;
          val_02.val._M_dataplus._M_p._0_4_ = in_stack_fffffffffffff760;
          val_02._0_8_ = in_stack_fffffffffffff758;
          val_02.val._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff764;
          val_02.val._M_string_length = (size_type)_Var20._M_p;
          val_02.val.field_2._M_allocated_capacity = (size_type)pCVar27;
          val_02.val.field_2._8_8_ = uVar28;
          val_02.keys.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffff780;
          val_02.keys.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)pUVar29;
          val_02.keys.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)puVar30;
          val_02.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)puVar31;
          val_02.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffff7a0;
          val_02.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)_Var32._M_p;
          UniValue::pushKV((UniValue *)local_288,key_01,val_02);
          UniValue::~UniValue(&local_410);
          if (local_3b8[0] != local_3a8) {
            operator_delete(local_3b8[0],local_3a8[0] + 1);
          }
          local_488 = local_478;
          local_480 = 0;
          local_468._8_8_ = auStack_450;
          local_468._0_4_ = VARR;
          auStack_450._1_3_ = (undefined3)local_478._1_8_;
          auStack_450._0_4_ = (uint)(uint3)auStack_450._1_3_ << 8;
          auStack_450._4_4_ = SUB84(local_478._1_8_,3);
          auStack_450[8] = SUB81(local_478._1_8_,7);
          auStack_450._9_4_ = local_46f;
          auStack_450._13_2_ = local_46b;
          auStack_450[0xf] = local_469;
          local_458 = (undefined1  [8])0x0;
          local_478[0] = 0;
          local_440._0_8_ = (ChainstateManager *)0x0;
          local_440._8_8_ = 0;
          local_430 = (pointer)0x0;
          pUStack_428 = (pointer)0x0;
          local_420 = (pointer)0x0;
          pUStack_418 = (pointer)0x0;
          uVar24 = SUB84(pCVar27,0);
          uVar25 = (undefined4)((ulong)pCVar27 >> 0x20);
          _Var26._M_p = _Var20._M_p;
          if ((pointer)_Var20._M_p != pCVar27) {
            do {
              local_508 = &local_4f8;
              local_4e8._0_4_ = VOBJ;
              auStack_4d0._0_8_ = (ulong)uStack_4f7 << 8;
              auStack_4d0._8_8_ = sStack_4f0;
              local_4d8 = (undefined1  [8])0x0;
              local_500 = 0;
              local_4f8 = 0;
              vStack_4a8.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
              super__Vector_impl_data._M_finish = (pointer)0x0;
              vStack_4a8.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              local_4b0 = (pointer)0x0;
              vStack_4a8.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)0x0;
              local_4c0._M_allocated_capacity = 0;
              local_4c0._8_8_ = 0;
              local_528[0] = local_518;
              local_4e8._8_8_ = (pointer)auStack_4d0;
              std::__cxx11::string::_M_construct<char_const*>((string *)local_528,"height","");
              local_650._0_4_ = *(undefined4 *)_Var20._M_p;
              UniValue::UniValue<int,_int,_true>(&local_580,(int *)local_650);
              key_02._M_string_length._0_4_ = uVar24;
              key_02._M_dataplus._M_p = (pointer)req;
              key_02._M_string_length._4_4_ = uVar25;
              key_02.field_2._M_allocated_capacity._0_4_ = in_stack_fffffffffffff748;
              key_02.field_2._M_allocated_capacity._4_4_ = in_stack_fffffffffffff74c;
              key_02.field_2._8_8_ = in_stack_fffffffffffff750;
              val_03.val._M_dataplus._M_p._0_4_ = in_stack_fffffffffffff760;
              val_03._0_8_ = in_stack_fffffffffffff758;
              val_03.val._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff764;
              val_03.val._M_string_length = (size_type)_Var26._M_p;
              val_03.val.field_2._M_allocated_capacity = (size_type)pCVar27;
              val_03.val.field_2._8_8_ = uVar28;
              val_03.keys.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffff780;
              val_03.keys.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish = (pointer)pUVar29;
              val_03.keys.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)puVar30;
              val_03.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)puVar31;
              val_03.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
              super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffff7a0;
              val_03.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = (pointer)_Var32._M_p;
              UniValue::pushKV((UniValue *)local_4e8,key_02,val_03);
              std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_580.values);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector(&local_580.keys);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_580.val._M_dataplus._M_p != &local_580.val.field_2) {
                operator_delete(local_580.val._M_dataplus._M_p,
                                local_580.val.field_2._M_allocated_capacity + 1);
              }
              if (local_528[0] != local_518) {
                operator_delete(local_528[0],local_518[0] + 1);
              }
              local_5a0[0] = local_590;
              std::__cxx11::string::_M_construct<char_const*>((string *)local_5a0,"value","");
              ValueFromAmount(&local_5f8,*(CAmount *)(_Var20._M_p + 8));
              key_03._M_string_length._0_4_ = uVar24;
              key_03._M_dataplus._M_p = (pointer)req;
              key_03._M_string_length._4_4_ = uVar25;
              key_03.field_2._M_allocated_capacity._0_4_ = in_stack_fffffffffffff748;
              key_03.field_2._M_allocated_capacity._4_4_ = in_stack_fffffffffffff74c;
              key_03.field_2._8_8_ = in_stack_fffffffffffff750;
              val_04.val._M_dataplus._M_p._0_4_ = in_stack_fffffffffffff760;
              val_04._0_8_ = in_stack_fffffffffffff758;
              val_04.val._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff764;
              val_04.val._M_string_length = (size_type)_Var26._M_p;
              val_04.val.field_2._M_allocated_capacity = (size_type)pCVar27;
              val_04.val.field_2._8_8_ = uVar28;
              val_04.keys.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffff780;
              val_04.keys.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish = (pointer)pUVar29;
              val_04.keys.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)puVar30;
              val_04.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)puVar31;
              val_04.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
              super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffff7a0;
              val_04.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = (pointer)_Var32._M_p;
              UniValue::pushKV((UniValue *)local_4e8,key_03,val_04);
              std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_5f8.values);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector(&local_5f8.keys);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_5f8.val._M_dataplus._M_p != &local_5f8.val.field_2) {
                operator_delete(local_5f8.val._M_dataplus._M_p,
                                local_5f8.val.field_2._M_allocated_capacity + 1);
              }
              if (local_5a0[0] != local_590) {
                operator_delete(local_5a0[0],local_590[0] + 1);
              }
              local_670 = &local_660;
              local_650._0_4_ = 1;
              local_650._8_8_ = local_640 + 8;
              local_640._8_8_ = (ulong)uStack_65f << 8;
              local_640._16_8_ = uStack_658;
              local_640._0_8_ = 0;
              local_668 = 0;
              local_660 = 0;
              vStack_610.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
              super__Vector_impl_data._M_finish = (pointer)0x0;
              vStack_610.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              local_628.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              vStack_610.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)0x0;
              local_628.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              local_628.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              ScriptToUniv((CScript *)(_Var20._M_p + 0x10),(UniValue *)local_650,true,true,
                           (SigningProvider *)0x0);
              local_690[0] = local_680;
              std::__cxx11::string::_M_construct<char_const*>((string *)local_690,"scriptPubKey","")
              ;
              local_6e8 = local_650._0_4_;
              local_6e0 = &local_6d0;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_650._8_8_ ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(local_640 + 8)) {
                local_6d0._8_8_ = local_640._16_8_;
              }
              else {
                local_6e0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_650._8_8_;
              }
              local_6d0._M_allocated_capacity = local_640._8_8_;
              local_6d8 = local_640._0_8_;
              local_640._0_8_ = 0;
              local_640._8_8_ = local_640._8_8_ & 0xffffffffffffff00;
              local_6c0.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start =
                   local_628.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
              local_6c0.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish =
                   local_628.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
              local_6c0.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage =
                   local_628.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
              local_628.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              local_628.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              local_628.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              local_6a8.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
              super__Vector_impl_data._M_start =
                   vStack_610.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                   super__Vector_impl_data._M_start;
              local_6a8.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   vStack_610.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                   super__Vector_impl_data._M_finish;
              local_6a8.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage =
                   vStack_610.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
              vStack_610.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              vStack_610.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)0x0;
              vStack_610.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
              super__Vector_impl_data._M_finish = (pointer)0x0;
              key_04._M_string_length._0_4_ = uVar24;
              key_04._M_dataplus._M_p = (pointer)req;
              key_04._M_string_length._4_4_ = uVar25;
              key_04.field_2._M_allocated_capacity._0_4_ = in_stack_fffffffffffff748;
              key_04.field_2._M_allocated_capacity._4_4_ = in_stack_fffffffffffff74c;
              key_04.field_2._8_8_ = in_stack_fffffffffffff750;
              val_05.val._M_dataplus._M_p._0_4_ = in_stack_fffffffffffff760;
              val_05._0_8_ = in_stack_fffffffffffff758;
              val_05.val._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff764;
              val_05.val._M_string_length = (size_type)_Var26._M_p;
              val_05.val.field_2._M_allocated_capacity = (size_type)pCVar27;
              val_05.val.field_2._8_8_ = uVar28;
              val_05.keys.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffff780;
              val_05.keys.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish = (pointer)pUVar29;
              val_05.keys.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)puVar30;
              val_05.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)puVar31;
              val_05.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
              super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffff7a0;
              val_05.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = (pointer)_Var32._M_p;
              local_650._8_8_ =
                   (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)(local_640 + 8);
              UniValue::pushKV((UniValue *)local_4e8,key_04,val_05);
              std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_6a8);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector(&local_6c0);
              if (local_6e0 != &local_6d0) {
                operator_delete(local_6e0,local_6d0._M_allocated_capacity + 1);
              }
              pbVar7 = (pointer)local_4e8._8_8_;
              if (local_690[0] != local_680) {
                operator_delete(local_690[0],local_680[0] + 1);
                pbVar7 = (pointer)local_4e8._8_8_;
              }
              local_738 = pbVar7;
              local_740 = local_4e8._0_4_;
              if (local_738 == (pointer)auStack_4d0) {
                local_728._8_8_ = auStack_4d0._8_8_;
                local_738 = (pointer)local_728;
              }
              local_728._0_8_ = auStack_4d0._0_8_;
              local_730 = (pointer)local_4d8;
              local_4d8 = (undefined1  [8])0x0;
              auStack_4d0._0_8_ = auStack_4d0._0_8_ & 0xffffffffffffff00;
              local_728._16_8_ = local_4c0._M_allocated_capacity;
              local_728._24_8_ = local_4c0._8_8_;
              local_708 = local_4b0;
              local_4b0 = (pointer)0x0;
              local_4c0._M_allocated_capacity = 0;
              local_4c0._8_8_ = 0;
              local_700.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
              super__Vector_impl_data._M_start =
                   vStack_4a8.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                   super__Vector_impl_data._M_start;
              local_700.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   vStack_4a8.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                   super__Vector_impl_data._M_finish;
              local_700.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage =
                   vStack_4a8.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
              vStack_4a8.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              vStack_4a8.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)0x0;
              vStack_4a8.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
              super__Vector_impl_data._M_finish = (pointer)0x0;
              val.val._M_dataplus._M_p._0_4_ = uVar24;
              val._0_8_ = req;
              val.val._M_dataplus._M_p._4_4_ = uVar25;
              val.val._M_string_length._0_4_ = in_stack_fffffffffffff748;
              val.val._M_string_length._4_4_ = in_stack_fffffffffffff74c;
              val.val.field_2._M_allocated_capacity = (size_type)in_stack_fffffffffffff750;
              val.val.field_2._8_8_ = in_stack_fffffffffffff758;
              val.keys.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start._0_4_ = in_stack_fffffffffffff760;
              val.keys.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start._4_4_ = in_stack_fffffffffffff764;
              val.keys.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish = (pointer)_Var26._M_p;
              val.keys.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)pCVar27;
              val.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)uVar28;
              val.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
              super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffff780;
              val.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = pUVar29;
              local_4e8._8_8_ = (pointer)auStack_4d0;
              UniValue::push_back((UniValue *)local_468,val);
              std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_700);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)(local_728 + 0x10));
              if (local_738 != (pointer)local_728) {
                operator_delete(local_738,(ulong)(local_728._0_8_ + 1));
              }
              std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&vStack_610);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector(&local_628);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_650._8_8_ !=
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(local_640 + 8)) {
                operator_delete((void *)local_650._8_8_,local_640._8_8_ + 1);
              }
              std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&vStack_4a8);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&local_4c0);
              if ((pointer)local_4e8._8_8_ != (pointer)auStack_4d0) {
                operator_delete((void *)local_4e8._8_8_,(ulong)(auStack_4d0._0_8_ + 1));
              }
              _Var20._M_p = _Var20._M_p + 0x30;
            } while (_Var20._M_p != (pointer)CONCAT44(uVar25,uVar24));
          }
          local_760[0] = local_750;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_760,"utxos","");
          local_7b8.typ = local_468._0_4_;
          local_7b8.val._M_dataplus._M_p = (pointer)local_468._8_8_;
          if ((pointer)local_468._8_8_ == (pointer)auStack_450) {
            local_7b8.val.field_2._8_8_ =
                 CONCAT17(auStack_450[0xf],
                          CONCAT25(auStack_450._13_2_,CONCAT41(auStack_450._9_4_,auStack_450[8])));
            local_7b8.val._M_dataplus._M_p = (pointer)&local_7b8.val.field_2;
          }
          local_7b8.val.field_2._M_allocated_capacity._4_4_ = auStack_450._4_4_;
          local_7b8.val.field_2._M_allocated_capacity._0_4_ = auStack_450._0_4_;
          local_7b8.val._M_string_length = (size_type)local_458;
          local_458 = (undefined1  [8])0x0;
          auStack_450._0_4_ = auStack_450._0_4_ & 0xffffff00;
          local_7b8.keys.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)local_440._0_8_;
          local_7b8.keys.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_440._8_8_;
          local_7b8.keys.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = local_430;
          local_430 = (pointer)0x0;
          local_440._0_8_ = (ChainstateManager *)0x0;
          local_440._8_8_ = 0;
          local_7b8.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
          super__Vector_impl_data._M_start = pUStack_428;
          local_7b8.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
          super__Vector_impl_data._M_finish = local_420;
          local_7b8.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = pUStack_418;
          pUStack_418 = (pointer)0x0;
          pUStack_428 = (pointer)0x0;
          local_420 = (pointer)0x0;
          key_05._M_string_length._0_4_ = uVar24;
          key_05._M_dataplus._M_p = (pointer)req;
          key_05._M_string_length._4_4_ = uVar25;
          key_05.field_2._M_allocated_capacity._0_4_ = in_stack_fffffffffffff748;
          key_05.field_2._M_allocated_capacity._4_4_ = in_stack_fffffffffffff74c;
          key_05.field_2._8_8_ = in_stack_fffffffffffff750;
          val_06.val._M_dataplus._M_p._0_4_ = in_stack_fffffffffffff760;
          val_06._0_8_ = in_stack_fffffffffffff758;
          val_06.val._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff764;
          val_06.val._M_string_length = (size_type)_Var26._M_p;
          val_06.val.field_2._M_allocated_capacity = (size_type)pCVar27;
          val_06.val.field_2._8_8_ = uVar28;
          val_06.keys.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffff780;
          val_06.keys.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)pUVar29;
          val_06.keys.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)puVar30;
          val_06.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)puVar31;
          val_06.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffff7a0;
          val_06.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)_Var32._M_p;
          local_468._8_8_ = (pointer)auStack_450;
          UniValue::pushKV((UniValue *)local_288,key_05,val_06);
          UniValue::~UniValue(&local_7b8);
          if (local_760[0] != local_750) {
            operator_delete(local_760[0],local_750[0] + 1);
          }
          UniValue::write_abi_cxx11_((UniValue *)local_650,(int)local_288,(void *)0x0,0);
          pbVar18 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_650,"\n");
          local_4e8._0_8_ = (pbVar18->_M_dataplus)._M_p;
          paVar15 = &pbVar18->field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_4e8._0_8_ == paVar15) {
            local_4d8 = (undefined1  [8])paVar15->_M_allocated_capacity;
            auStack_4d0._0_8_ = *(ulong *)((long)&pbVar18->field_2 + 8);
            local_4e8._0_8_ = (pointer)local_4d8;
          }
          else {
            local_4d8 = (undefined1  [8])paVar15->_M_allocated_capacity;
          }
          local_4e8._8_4_ = (undefined4)pbVar18->_M_string_length;
          local_4e8._12_4_ = (undefined4)(pbVar18->_M_string_length >> 0x20);
          (pbVar18->_M_dataplus)._M_p = (pointer)paVar15;
          pbVar18->_M_string_length = 0;
          (pbVar18->field_2)._M_local_buf[0] = '\0';
          pRVar2 = (RecursiveMutex *)(local_650 + 0x10);
          if ((RecursiveMutex *)local_650._0_8_ != pRVar2) {
            operator_delete((void *)local_650._0_8_,local_640._0_8_ + 1);
          }
          local_650._0_8_ = pRVar2;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_650,"Content-Type","");
          local_7d8._M_dataplus._M_p = (pointer)&local_7d8.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_7d8,"application/json","");
          HTTPRequest::WriteHeader(req,(string *)local_650,&local_7d8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_7d8._M_dataplus._M_p != &local_7d8.field_2) {
            operator_delete(local_7d8._M_dataplus._M_p,local_7d8.field_2._M_allocated_capacity + 1);
          }
          if ((RecursiveMutex *)local_650._0_8_ != pRVar2) {
            operator_delete((void *)local_650._0_8_,local_640._0_8_ + 1);
          }
          reply._M_extent._M_extent_value._0_4_ = local_4e8._8_4_;
          reply._M_ptr = (pointer)local_4e8._0_8_;
          reply._M_extent._M_extent_value._4_4_ = local_4e8._12_4_;
          HTTPRequest::WriteReply(req,200,reply);
          if ((pointer)local_4e8._0_8_ != (pointer)local_4d8) {
            operator_delete((void *)local_4e8._0_8_,(ulong)((long)local_4d8 + 1));
          }
          UniValue::~UniValue((UniValue *)local_468);
          UniValue::~UniValue((UniValue *)local_288);
        }
        bVar8 = true;
      }
      if (local_820._M_dataplus._M_p != (pointer)0x0) {
        operator_delete(local_820._M_dataplus._M_p,local_800 - (long)local_820._M_dataplus._M_p);
        local_820._M_dataplus._M_p = (pointer)0x0;
        local_820._M_string_length._0_4_ = 0;
        local_820.field_2._M_allocated_capacity = 0;
        local_820.field_2._8_4_ = 0;
        local_800 = 0;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
        operator_delete(local_1b8._M_dataplus._M_p,
                        CONCAT71(local_1b8.field_2._M_allocated_capacity._1_7_,
                                 local_1b8.field_2._M_local_buf[0]) + 1);
      }
      std::vector<CCoin,_std::allocator<CCoin>_>::~vector
                ((vector<CCoin,_std::allocator<CCoin>_> *)&stack0xfffffffffffff768);
      if (pUVar29 != (pointer)0x0) {
        operator_delete(pUVar29,(long)puVar31 - (long)pUVar29);
      }
    }
    else {
      in_stack_fffffffffffff750 =
           local_838.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      iVar10 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               compare(local_838.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,"checkmempool");
      bVar8 = iVar10 == 0;
      in_stack_fffffffffffff74c = CONCAT31((int3)((uint)iVar10 >> 8),bVar8);
      pbVar18 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(ulong)bVar8;
      in_RCX = (undefined1  [8])
               ((long)local_838.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)local_838.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 5);
      if (pbVar18 < (ulong)in_RCX) {
        uVar16 = (ulong)bVar8 << 5 | 8;
        do {
          local_288._0_8_ =
               *(long *)((long)local_838.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start + (uVar16 - 8));
          local_288._8_8_ =
               *(size_type *)
                ((long)&((local_838.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + uVar16);
          local_468[0] = (util)0x2d;
          separators_00._M_str = (char *)in_R8;
          separators_00._M_len = (size_t)local_468;
          util::Split<std::basic_string_view<char,std::char_traits<char>>>
                    ((vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                      *)local_4e8,(util *)local_288,(Span<const_char> *)0x1,separators_00);
          puVar3 = (undefined8 *)CONCAT44(local_4e8._4_4_,local_4e8._0_4_);
          if (CONCAT44(local_4e8._12_4_,local_4e8._8_4_) - (long)puVar3 != 0x20) {
            local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"Parse error","");
            RESTERR(req,HTTP_BAD_REQUEST,&local_b8);
            _Var20._M_p = local_b8._M_dataplus._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
LAB_0028e9d9:
              operator_delete(_Var20._M_p,local_b8.field_2._M_allocated_capacity + 1);
            }
LAB_0028e9e1:
            local_198._M_dataplus._M_p = (pointer)CONCAT44(local_4e8._4_4_,local_4e8._0_4_);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_198._M_dataplus._M_p ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0x0) goto LAB_0028ed84;
            pcVar17 = (pointer)((long)local_4d8 - (long)local_198._M_dataplus._M_p);
            goto LAB_0028ed7f;
          }
          str._M_str = (char *)0x20;
          str._M_len = puVar3[1];
          detail::FromHex<uint256>((optional<uint256> *)local_288,(detail *)*puVar3,str);
          auStack_450[8] = local_278[0x10] != '\0';
          if ((bool)auStack_450[8]) {
            local_458 = (undefined1  [8])local_278._0_8_;
            auStack_450._0_4_ = local_278._8_4_;
            auStack_450._4_4_ = local_278._12_4_;
            local_468._0_4_ = local_288._0_4_;
            local_468._4_4_ = local_288._4_4_;
            local_468._8_4_ = local_288._8_4_;
            local_468._12_4_ = local_288._12_4_;
          }
          lVar4 = CONCAT44(local_4e8._4_4_,local_4e8._0_4_);
          if ((ulong)(CONCAT44(local_4e8._12_4_,local_4e8._8_4_) - lVar4 >> 4) < 2) {
            if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
              uVar28 = std::__throw_out_of_range_fmt
                                 ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                                  ,1);
              if ((transaction_identifier<false> *)CONCAT44(local_4e8._4_4_,local_4e8._0_4_) !=
                  (transaction_identifier<false> *)local_468) {
                operator_delete((transaction_identifier<false> *)
                                CONCAT44(local_4e8._4_4_,local_4e8._0_4_),
                                (ulong)((long)local_4d8 + 1));
              }
              UniValue::~UniValue((UniValue *)local_468);
              UniValue::~UniValue((UniValue *)local_288);
              if (local_820._M_dataplus._M_p != (pointer)0x0) {
                operator_delete(local_820._M_dataplus._M_p,
                                local_800 - (long)local_820._M_dataplus._M_p);
                local_820._M_dataplus._M_p = (pointer)0x0;
                local_820._M_string_length._0_4_ = 0;
                local_820.field_2._M_allocated_capacity = 0;
                local_820.field_2._8_4_ = 0;
                local_800 = 0;
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
                operator_delete(local_1b8._M_dataplus._M_p,
                                CONCAT71(local_1b8.field_2._M_allocated_capacity._1_7_,
                                         local_1b8.field_2._M_local_buf[0]) + 1);
              }
              std::vector<CCoin,_std::allocator<CCoin>_>::~vector
                        ((vector<CCoin,_std::allocator<CCoin>_> *)&stack0xfffffffffffff768);
              if (in_stack_fffffffffffff788 != (pointer)0x0) {
                operator_delete(in_stack_fffffffffffff788,
                                (long)in_stack_fffffffffffff798 - (long)in_stack_fffffffffffff788);
              }
              if ((pointer)_Var32._M_p != (pointer)0x0) {
                operator_delete(_Var32._M_p,-(long)_Var32._M_p);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_78._M_dataplus._M_p != &local_78.field_2) {
                operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1
                               );
              }
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector(&local_838);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_58._M_dataplus._M_p != &local_58.field_2) {
                operator_delete(local_58._M_dataplus._M_p,
                                CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,
                                         local_58.field_2._M_local_buf[0]) + 1);
              }
              if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                _Unwind_Resume(uVar28);
              }
            }
            goto LAB_00290955;
          }
          pcVar19 = *(char **)(lVar4 + 0x18) + *(long *)(lVar4 + 0x10);
          _Var23 = std::from_chars<unsigned_int>
                             (*(char **)(lVar4 + 0x18),pcVar19,(uint *)local_650,10);
          if (_Var23.ec == 0) {
            pbVar14 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      (local_650._0_8_ & 0xffffffff | 0x100000000);
          }
          else {
            pbVar14 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          }
          if (_Var23.ptr != pcVar19) {
            pbVar14 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          }
          local_288._0_8_ = pbVar14;
          if ((auStack_450[8] != '\x01') ||
             (local_288[4] = (char)((ulong)pbVar14 >> 0x20), local_288[4] == '\0')) {
            local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"Parse error","");
            RESTERR(req,HTTP_BAD_REQUEST,&local_d8);
            local_b8.field_2._M_allocated_capacity = local_d8.field_2._M_allocated_capacity;
            _Var20._M_p = local_d8._M_dataplus._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_d8._M_dataplus._M_p != &local_d8.field_2) goto LAB_0028e9d9;
            goto LAB_0028e9e1;
          }
          std::vector<COutPoint,std::allocator<COutPoint>>::
          emplace_back<transaction_identifier<false>&,unsigned_int&>
                    ((vector<COutPoint,std::allocator<COutPoint>> *)&stack0xfffffffffffff7a8,
                     (transaction_identifier<false> *)local_468,(uint *)local_288);
          pvVar5 = (void *)CONCAT44(local_4e8._4_4_,local_4e8._0_4_);
          if (pvVar5 != (void *)0x0) {
            operator_delete(pvVar5,(long)local_4d8 - (long)pvVar5);
          }
          pbVar18 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    ((long)&(pbVar18->_M_dataplus)._M_p + 1);
          in_RCX = (undefined1  [8])
                   ((long)local_838.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)local_838.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 5);
          uVar16 = uVar16 + 0x20;
        } while (pbVar18 < (ulong)in_RCX);
      }
      cVar22 = (char)in_stack_fffffffffffff74c;
      pbVar18 = in_stack_fffffffffffff750;
      in_stack_fffffffffffff758 = context;
      if ((pointer)_Var32._M_p != (pointer)0x0) goto LAB_0028e71a;
      local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"Error: empty request","")
      ;
      RESTERR(req,HTTP_BAD_REQUEST,&local_f8);
      local_158[0].field_2._M_allocated_capacity = local_f8.field_2._M_allocated_capacity;
      local_198._M_dataplus._M_p = local_f8._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8._M_dataplus._M_p != &local_f8.field_2) goto LAB_0028ed7c;
LAB_0028ed84:
      bVar8 = false;
    }
    if ((pointer)_Var32._M_p != (pointer)0x0) {
      operator_delete(_Var32._M_p,-(long)_Var32._M_p);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_838);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,
                    CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,
                             local_58.field_2._M_local_buf[0]) + 1);
  }
LAB_0028edf3:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar8;
  }
LAB_00290955:
  __stack_chk_fail();
}

Assistant:

static bool rest_getutxos(const std::any& context, HTTPRequest* req, const std::string& strURIPart)
{
    if (!CheckWarmup(req))
        return false;
    std::string param;
    const RESTResponseFormat rf = ParseDataFormat(param, strURIPart);

    std::vector<std::string> uriParts;
    if (param.length() > 1)
    {
        std::string strUriParams = param.substr(1);
        uriParts = SplitString(strUriParams, '/');
    }

    // throw exception in case of an empty request
    std::string strRequestMutable = req->ReadBody();
    if (strRequestMutable.length() == 0 && uriParts.size() == 0)
        return RESTERR(req, HTTP_BAD_REQUEST, "Error: empty request");

    bool fInputParsed = false;
    bool fCheckMemPool = false;
    std::vector<COutPoint> vOutPoints;

    // parse/deserialize input
    // input-format = output-format, rest/getutxos/bin requires binary input, gives binary output, ...

    if (uriParts.size() > 0)
    {
        //inputs is sent over URI scheme (/rest/getutxos/checkmempool/txid1-n/txid2-n/...)
        if (uriParts[0] == "checkmempool") fCheckMemPool = true;

        for (size_t i = (fCheckMemPool) ? 1 : 0; i < uriParts.size(); i++)
        {
            const auto txid_out{util::Split<std::string_view>(uriParts[i], '-')};
            if (txid_out.size() != 2) {
                return RESTERR(req, HTTP_BAD_REQUEST, "Parse error");
            }
            auto txid{Txid::FromHex(txid_out.at(0))};
            auto output{ToIntegral<uint32_t>(txid_out.at(1))};

            if (!txid || !output) {
                return RESTERR(req, HTTP_BAD_REQUEST, "Parse error");
            }

            vOutPoints.emplace_back(*txid, *output);
        }

        if (vOutPoints.size() > 0)
            fInputParsed = true;
        else
            return RESTERR(req, HTTP_BAD_REQUEST, "Error: empty request");
    }

    switch (rf) {
    case RESTResponseFormat::HEX: {
        // convert hex to bin, continue then with bin part
        std::vector<unsigned char> strRequestV = ParseHex(strRequestMutable);
        strRequestMutable.assign(strRequestV.begin(), strRequestV.end());
        [[fallthrough]];
    }

    case RESTResponseFormat::BINARY: {
        try {
            //deserialize only if user sent a request
            if (strRequestMutable.size() > 0)
            {
                if (fInputParsed) //don't allow sending input over URI and HTTP RAW DATA
                    return RESTERR(req, HTTP_BAD_REQUEST, "Combination of URI scheme inputs and raw post data is not allowed");

                DataStream oss{};
                oss << strRequestMutable;
                oss >> fCheckMemPool;
                oss >> vOutPoints;
            }
        } catch (const std::ios_base::failure&) {
            // abort in case of unreadable binary data
            return RESTERR(req, HTTP_BAD_REQUEST, "Parse error");
        }
        break;
    }

    case RESTResponseFormat::JSON: {
        if (!fInputParsed)
            return RESTERR(req, HTTP_BAD_REQUEST, "Error: empty request");
        break;
    }
    default: {
        return RESTERR(req, HTTP_NOT_FOUND, "output format not found (available: " + AvailableDataFormatsString() + ")");
    }
    }

    // limit max outpoints
    if (vOutPoints.size() > MAX_GETUTXOS_OUTPOINTS)
        return RESTERR(req, HTTP_BAD_REQUEST, strprintf("Error: max outpoints exceeded (max: %d, tried: %d)", MAX_GETUTXOS_OUTPOINTS, vOutPoints.size()));

    // check spentness and form a bitmap (as well as a JSON capable human-readable string representation)
    std::vector<unsigned char> bitmap;
    std::vector<CCoin> outs;
    std::string bitmapStringRepresentation;
    std::vector<bool> hits;
    bitmap.resize((vOutPoints.size() + 7) / 8);
    ChainstateManager* maybe_chainman = GetChainman(context, req);
    if (!maybe_chainman) return false;
    ChainstateManager& chainman = *maybe_chainman;
    decltype(chainman.ActiveHeight()) active_height;
    uint256 active_hash;
    {
        auto process_utxos = [&vOutPoints, &outs, &hits, &active_height, &active_hash, &chainman](const CCoinsView& view, const CTxMemPool* mempool) EXCLUSIVE_LOCKS_REQUIRED(chainman.GetMutex()) {
            for (const COutPoint& vOutPoint : vOutPoints) {
                Coin coin;
                bool hit = (!mempool || !mempool->isSpent(vOutPoint)) && view.GetCoin(vOutPoint, coin);
                hits.push_back(hit);
                if (hit) outs.emplace_back(std::move(coin));
            }
            active_height = chainman.ActiveHeight();
            active_hash = chainman.ActiveTip()->GetBlockHash();
        };

        if (fCheckMemPool) {
            const CTxMemPool* mempool = GetMemPool(context, req);
            if (!mempool) return false;
            // use db+mempool as cache backend in case user likes to query mempool
            LOCK2(cs_main, mempool->cs);
            CCoinsViewCache& viewChain = chainman.ActiveChainstate().CoinsTip();
            CCoinsViewMemPool viewMempool(&viewChain, *mempool);
            process_utxos(viewMempool, mempool);
        } else {
            LOCK(cs_main);
            process_utxos(chainman.ActiveChainstate().CoinsTip(), nullptr);
        }

        for (size_t i = 0; i < hits.size(); ++i) {
            const bool hit = hits[i];
            bitmapStringRepresentation.append(hit ? "1" : "0"); // form a binary string representation (human-readable for json output)
            bitmap[i / 8] |= ((uint8_t)hit) << (i % 8);
        }
    }

    switch (rf) {
    case RESTResponseFormat::BINARY: {
        // serialize data
        // use exact same output as mentioned in Bip64
        DataStream ssGetUTXOResponse{};
        ssGetUTXOResponse << active_height << active_hash << bitmap << outs;

        req->WriteHeader("Content-Type", "application/octet-stream");
        req->WriteReply(HTTP_OK, ssGetUTXOResponse);
        return true;
    }

    case RESTResponseFormat::HEX: {
        DataStream ssGetUTXOResponse{};
        ssGetUTXOResponse << active_height << active_hash << bitmap << outs;
        std::string strHex = HexStr(ssGetUTXOResponse) + "\n";

        req->WriteHeader("Content-Type", "text/plain");
        req->WriteReply(HTTP_OK, strHex);
        return true;
    }

    case RESTResponseFormat::JSON: {
        UniValue objGetUTXOResponse(UniValue::VOBJ);

        // pack in some essentials
        // use more or less the same output as mentioned in Bip64
        objGetUTXOResponse.pushKV("chainHeight", active_height);
        objGetUTXOResponse.pushKV("chaintipHash", active_hash.GetHex());
        objGetUTXOResponse.pushKV("bitmap", bitmapStringRepresentation);

        UniValue utxos(UniValue::VARR);
        for (const CCoin& coin : outs) {
            UniValue utxo(UniValue::VOBJ);
            utxo.pushKV("height", (int32_t)coin.nHeight);
            utxo.pushKV("value", ValueFromAmount(coin.out.nValue));

            // include the script in a json output
            UniValue o(UniValue::VOBJ);
            ScriptToUniv(coin.out.scriptPubKey, /*out=*/o, /*include_hex=*/true, /*include_address=*/true);
            utxo.pushKV("scriptPubKey", std::move(o));
            utxos.push_back(std::move(utxo));
        }
        objGetUTXOResponse.pushKV("utxos", std::move(utxos));

        // return json string
        std::string strJSON = objGetUTXOResponse.write() + "\n";
        req->WriteHeader("Content-Type", "application/json");
        req->WriteReply(HTTP_OK, strJSON);
        return true;
    }
    default: {
        return RESTERR(req, HTTP_NOT_FOUND, "output format not found (available: " + AvailableDataFormatsString() + ")");
    }
    }
}